

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

bool ProcessDifferentials<Blob<128>>
               (vector<Blob<128>,_std::allocator<Blob<128>_>_> *diffs,int reps,bool dumpCollisions)

{
  __normal_iterator<Blob<128>_*,_std::vector<Blob<128>,_std::allocator<Blob<128>_>_>_> __first;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  byte in_DL;
  int in_ESI;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_RDI;
  double pct_1;
  double pct;
  int i;
  Blob<128> kp;
  bool result;
  int ignore;
  int count;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  __normal_iterator<Blob<128>_*,_std::vector<Blob<128>,_std::allocator<Blob<128>_>_>_>
  in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  int iVar6;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_28;
  int local_24;
  
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::begin
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::end
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  __first._M_current._4_4_ = in_stack_ffffffffffffffc4;
  __first._M_current._0_4_ = in_stack_ffffffffffffffc0;
  std::
  sort<__gnu_cxx::__normal_iterator<Blob<128>*,std::vector<Blob<128>,std::allocator<Blob<128>>>>>
            (__first,in_stack_ffffffffffffffb8);
  local_24 = 1;
  local_28 = 0;
  bVar1 = true;
  sVar3 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::size(in_RDI);
  if (sVar3 != 0) {
    pvVar4 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::operator[](in_RDI,0);
    Blob<128>::Blob((Blob<128> *)&stack0xffffffffffffffc7,pvVar4);
    iVar5 = 1;
    while (iVar6 = iVar5, sVar3 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::size(in_RDI),
          iVar5 < (int)sVar3) {
      pvVar4 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::operator[](in_RDI,(long)iVar6);
      bVar2 = Blob<128>::operator==(pvVar4,(Blob<128> *)&stack0xffffffffffffffc7);
      if (bVar2) {
        local_24 = local_24 + 1;
      }
      else {
        if (local_24 < 2) {
          local_28 = local_28 + 1;
        }
        else {
          bVar1 = false;
          in_stack_ffffffffffffffb8._M_current =
               (Blob<128> *)(((double)local_24 / (double)in_ESI) * 100.0);
          if ((in_DL & 1) != 0) {
            printbits((void *)CONCAT44(in_stack_ffffffffffffffc4,iVar6),
                      (int)((ulong)in_stack_ffffffffffffffb8._M_current >> 0x20));
            printf(" - %4.2f%%\n",in_stack_ffffffffffffffb8._M_current);
          }
        }
        pvVar4 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::operator[](in_RDI,(long)iVar6)
        ;
        Blob<128>::operator=((Blob<128> *)&stack0xffffffffffffffc7,pvVar4);
        local_24 = 1;
      }
      iVar5 = iVar6 + 1;
    }
    if (local_24 < 2) {
      local_28 = local_28 + 1;
    }
    else if ((in_DL & 1) != 0) {
      printbits((void *)CONCAT44(in_stack_ffffffffffffffc4,iVar6),
                (int)((ulong)in_stack_ffffffffffffffb8._M_current >> 0x20));
      printf(" - %4.2f%%\n",((double)local_24 / (double)in_ESI) * 100.0);
    }
  }
  sVar3 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::size(in_RDI);
  printf("%d total collisions, of which %d single collisions were ignored",sVar3 & 0xffffffff,
         (ulong)local_28);
  if (bVar1 == false) {
    printf(" !!!!!");
  }
  printf("\n\n");
  return bVar1;
}

Assistant:

bool ProcessDifferentials ( std::vector<keytype> & diffs, int reps, bool dumpCollisions )
{
  std::sort(diffs.begin(), diffs.end());

  int count = 1;
  int ignore = 0;

  bool result = true;

  if(diffs.size())
  {
    keytype kp = diffs[0];

    for(int i = 1; i < (int)diffs.size(); i++)
    {
      if(diffs[i] == kp)
      {
        count++;
        continue;
      }
      else
      {
        if(count > 1)
        {
          result = false;

          double pct = 100 * (double(count) / double(reps));

          if(dumpCollisions)
          {
            printbits((unsigned char*)&kp,sizeof(kp));
            printf(" - %4.2f%%\n", pct );
          }
        }
        else 
        {
          ignore++;
        }

        kp = diffs[i];
        count = 1;
      }
    }

    if(count > 1)
    {
      double pct = 100 * (double(count) / double(reps));

      if(dumpCollisions)
      {
        printbits((unsigned char*)&kp,sizeof(kp));
        printf(" - %4.2f%%\n", pct );
      }
    }
    else 
    {
      ignore++;
    }
  }

  printf("%d total collisions, of which %d single collisions were ignored",
         (int)diffs.size(),ignore);

  if(result == false)
  {
    printf(" !!!!!");
  }

  printf("\n\n");

  return result;
}